

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::GELU_x86_fma::forward_inplace(GELU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  undefined1 auVar5 [32];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  long lVar20;
  undefined1 (*pauVar21) [32];
  int iVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [64];
  float fVar29;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined4 in_register_0000125c;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 extraout_var [60];
  
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_GELU_x86_fma[-3]) != 0) {
    iVar22 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar26 = 0;
    uVar25 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar25 = uVar26;
    }
    for (; uVar26 != uVar25; uVar26 = uVar26 + 1) {
      pvVar2 = bottom_top_blob->data;
      sVar3 = bottom_top_blob->elemsize;
      sVar4 = bottom_top_blob->cstep;
      pauVar21 = (undefined1 (*) [32])(sVar4 * uVar26 * sVar3 + (long)pvVar2);
      lVar24 = 0;
      for (iVar23 = 0; iVar23 + 7 < iVar22; iVar23 = iVar23 + 8) {
        auVar1 = *pauVar21;
        fVar6 = auVar1._0_4_;
        fVar7 = auVar1._4_4_;
        fVar8 = auVar1._8_4_;
        fVar9 = auVar1._12_4_;
        fVar10 = auVar1._16_4_;
        fVar12 = auVar1._20_4_;
        fVar14 = auVar1._24_4_;
        auVar5._4_4_ = fVar7 * fVar7 * 0.044715;
        auVar5._0_4_ = fVar6 * fVar6 * 0.044715;
        auVar5._8_4_ = fVar8 * fVar8 * 0.044715;
        auVar5._12_4_ = fVar9 * fVar9 * 0.044715;
        auVar5._16_4_ = fVar10 * fVar10 * 0.044715;
        auVar5._20_4_ = fVar12 * fVar12 * 0.044715;
        auVar5._24_4_ = fVar14 * fVar14 * 0.044715;
        auVar5._28_4_ = in_register_0000125c;
        auVar36 = vfmadd213ps_fma(auVar5,auVar1,auVar1);
        auVar39._8_4_ = 0xc1100000;
        auVar39._0_8_ = 0xc1100000c1100000;
        auVar39._12_4_ = 0xc1100000;
        auVar39._16_4_ = 0xc1100000;
        auVar39._20_4_ = 0xc1100000;
        auVar39._24_4_ = 0xc1100000;
        auVar39._28_4_ = 0xc1100000;
        auVar5 = vmaxps_avx(auVar39,ZEXT1632(CONCAT412(auVar36._12_4_ * 0.7978845,
                                                       CONCAT48(auVar36._8_4_ * 0.7978845,
                                                                CONCAT44(auVar36._4_4_ * 0.7978845,
                                                                         auVar36._0_4_ * 0.7978845))
                                                      )));
        auVar40._8_4_ = 0x41100000;
        auVar40._0_8_ = 0x4110000041100000;
        auVar40._12_4_ = 0x41100000;
        auVar40._16_4_ = 0x41100000;
        auVar40._20_4_ = 0x41100000;
        auVar40._24_4_ = 0x41100000;
        auVar40._28_4_ = 0x41100000;
        auVar5 = vminps_avx(auVar40,auVar5);
        fVar29 = auVar5._0_4_;
        fVar33 = auVar5._4_4_;
        auVar16._4_4_ = fVar33 * fVar33;
        auVar16._0_4_ = fVar29 * fVar29;
        fVar34 = auVar5._8_4_;
        auVar16._8_4_ = fVar34 * fVar34;
        fVar35 = auVar5._12_4_;
        auVar16._12_4_ = fVar35 * fVar35;
        fVar11 = auVar5._16_4_;
        auVar16._16_4_ = fVar11 * fVar11;
        fVar13 = auVar5._20_4_;
        auVar16._20_4_ = fVar13 * fVar13;
        fVar15 = auVar5._24_4_;
        auVar16._24_4_ = fVar15 * fVar15;
        auVar16._28_4_ = 0x41100000;
        auVar43._8_4_ = 0xa59f25c0;
        auVar43._0_8_ = 0xa59f25c0a59f25c0;
        auVar43._12_4_ = 0xa59f25c0;
        auVar43._16_4_ = 0xa59f25c0;
        auVar43._20_4_ = 0xa59f25c0;
        auVar43._24_4_ = 0xa59f25c0;
        auVar43._28_4_ = 0xa59f25c0;
        auVar52._8_4_ = 0x2a61337e;
        auVar52._0_8_ = 0x2a61337e2a61337e;
        auVar52._12_4_ = 0x2a61337e;
        auVar52._16_4_ = 0x2a61337e;
        auVar52._20_4_ = 0x2a61337e;
        auVar52._24_4_ = 0x2a61337e;
        auVar52._28_4_ = 0x2a61337e;
        auVar36 = vfmadd213ps_fma(auVar43,auVar16,auVar52);
        auVar53._8_4_ = 0xaebd37ff;
        auVar53._0_8_ = 0xaebd37ffaebd37ff;
        auVar53._12_4_ = 0xaebd37ff;
        auVar53._16_4_ = 0xaebd37ff;
        auVar53._20_4_ = 0xaebd37ff;
        auVar53._24_4_ = 0xaebd37ff;
        auVar53._28_4_ = 0xaebd37ff;
        auVar36 = vfmadd213ps_fma(ZEXT1632(auVar36),auVar16,auVar53);
        auVar54._8_4_ = 0x335c0041;
        auVar54._0_8_ = 0x335c0041335c0041;
        auVar54._12_4_ = 0x335c0041;
        auVar54._16_4_ = 0x335c0041;
        auVar54._20_4_ = 0x335c0041;
        auVar54._24_4_ = 0x335c0041;
        auVar54._28_4_ = 0x335c0041;
        auVar36 = vfmadd213ps_fma(ZEXT1632(auVar36),auVar16,auVar54);
        auVar55._8_4_ = 0x3779434a;
        auVar55._0_8_ = 0x3779434a3779434a;
        auVar55._12_4_ = 0x3779434a;
        auVar55._16_4_ = 0x3779434a;
        auVar55._20_4_ = 0x3779434a;
        auVar55._24_4_ = 0x3779434a;
        auVar55._28_4_ = 0x3779434a;
        auVar36 = vfmadd213ps_fma(ZEXT1632(auVar36),auVar16,auVar55);
        auVar56._8_4_ = 0x3a270ded;
        auVar56._0_8_ = 0x3a270ded3a270ded;
        auVar56._12_4_ = 0x3a270ded;
        auVar56._16_4_ = 0x3a270ded;
        auVar56._20_4_ = 0x3a270ded;
        auVar56._24_4_ = 0x3a270ded;
        auVar56._28_4_ = 0x3a270ded;
        auVar36 = vfmadd213ps_fma(ZEXT1632(auVar36),auVar16,auVar56);
        auVar57._8_4_ = 0x3ba059dc;
        auVar57._0_8_ = 0x3ba059dc3ba059dc;
        auVar57._12_4_ = 0x3ba059dc;
        auVar57._16_4_ = 0x3ba059dc;
        auVar57._20_4_ = 0x3ba059dc;
        auVar57._24_4_ = 0x3ba059dc;
        auVar57._28_4_ = 0x3ba059dc;
        auVar36 = vfmadd213ps_fma(ZEXT1632(auVar36),auVar16,auVar57);
        fVar29 = auVar36._0_4_ * fVar29;
        fVar33 = auVar36._4_4_ * fVar33;
        auVar17._4_4_ = fVar33;
        auVar17._0_4_ = fVar29;
        fVar34 = auVar36._8_4_ * fVar34;
        auVar17._8_4_ = fVar34;
        fVar35 = auVar36._12_4_ * fVar35;
        auVar17._12_4_ = fVar35;
        auVar17._16_4_ = fVar11 * 0.0;
        auVar17._20_4_ = fVar13 * 0.0;
        auVar17._24_4_ = fVar15 * 0.0;
        auVar17._28_4_ = auVar5._28_4_;
        auVar44._8_4_ = 0x35a0d3d8;
        auVar44._0_8_ = 0x35a0d3d835a0d3d8;
        auVar44._12_4_ = 0x35a0d3d8;
        auVar44._16_4_ = 0x35a0d3d8;
        auVar44._20_4_ = 0x35a0d3d8;
        auVar44._24_4_ = 0x35a0d3d8;
        auVar44._28_4_ = 0x35a0d3d8;
        auVar60._8_4_ = 0x38f895d6;
        auVar60._0_8_ = 0x38f895d638f895d6;
        auVar60._12_4_ = 0x38f895d6;
        auVar60._16_4_ = 0x38f895d6;
        auVar60._20_4_ = 0x38f895d6;
        auVar60._24_4_ = 0x38f895d6;
        auVar60._28_4_ = 0x38f895d6;
        auVar36 = vfmadd213ps_fma(auVar44,auVar16,auVar60);
        auVar61._8_4_ = 0x3b14aa05;
        auVar61._0_8_ = 0x3b14aa053b14aa05;
        auVar61._12_4_ = 0x3b14aa05;
        auVar61._16_4_ = 0x3b14aa05;
        auVar61._20_4_ = 0x3b14aa05;
        auVar61._24_4_ = 0x3b14aa05;
        auVar61._28_4_ = 0x3b14aa05;
        auVar36 = vfmadd213ps_fma(ZEXT1632(auVar36),auVar16,auVar61);
        auVar36 = vfmadd213ps_fma(ZEXT1632(auVar36),auVar16,auVar57);
        auVar5 = vrcpps_avx(ZEXT1632(auVar36));
        auVar18._4_4_ = fVar33 * auVar5._4_4_;
        auVar18._0_4_ = fVar29 * auVar5._0_4_;
        auVar18._8_4_ = fVar34 * auVar5._8_4_;
        auVar18._12_4_ = fVar35 * auVar5._12_4_;
        auVar18._16_4_ = fVar11 * 0.0 * auVar5._16_4_;
        auVar18._20_4_ = fVar13 * 0.0 * auVar5._20_4_;
        auVar18._24_4_ = fVar15 * 0.0 * auVar5._24_4_;
        auVar18._28_4_ = 0x3ba059dc;
        auVar36 = vfmsub213ps_fma(ZEXT1632(auVar36),auVar18,auVar17);
        auVar36 = vfnmadd213ps_fma(ZEXT1632(auVar36),auVar5,auVar18);
        in_register_0000125c = 0x3f000000;
        auVar19._4_4_ = fVar7 * 0.5;
        auVar19._0_4_ = fVar6 * 0.5;
        auVar19._8_4_ = fVar8 * 0.5;
        auVar19._12_4_ = fVar9 * 0.5;
        auVar19._16_4_ = fVar10 * 0.5;
        auVar19._20_4_ = fVar12 * 0.5;
        auVar19._24_4_ = fVar14 * 0.5;
        auVar19._28_4_ = auVar1._28_4_;
        auVar36 = vfmadd213ps_fma(auVar19,ZEXT1632(auVar36),auVar19);
        *pauVar21 = ZEXT1632(auVar36);
        pauVar21 = pauVar21 + 1;
        lVar24 = lVar24 + 8;
      }
      for (; iVar23 + 3 < iVar22; iVar23 = iVar23 + 4) {
        auVar36 = *(undefined1 (*) [16])*pauVar21;
        fVar6 = auVar36._0_4_;
        fVar7 = auVar36._4_4_;
        fVar8 = auVar36._8_4_;
        fVar9 = auVar36._12_4_;
        auVar30._0_4_ = fVar6 * fVar6 * 0.044715;
        auVar30._4_4_ = fVar7 * fVar7 * 0.044715;
        auVar30._8_4_ = fVar8 * fVar8 * 0.044715;
        auVar30._12_4_ = fVar9 * fVar9 * 0.044715;
        auVar36 = vfmadd213ps_fma(auVar30,auVar36,auVar36);
        auVar31._0_4_ = auVar36._0_4_ * 0.7978845;
        auVar31._4_4_ = auVar36._4_4_ * 0.7978845;
        auVar31._8_4_ = auVar36._8_4_ * 0.7978845;
        auVar31._12_4_ = auVar36._12_4_ * 0.7978845;
        auVar36._8_4_ = 0xc1100000;
        auVar36._0_8_ = 0xc1100000c1100000;
        auVar36._12_4_ = 0xc1100000;
        auVar36 = vmaxps_avx(auVar36,auVar31);
        auVar37._8_4_ = 0x41100000;
        auVar37._0_8_ = 0x4110000041100000;
        auVar37._12_4_ = 0x41100000;
        auVar36 = vminps_avx(auVar37,auVar36);
        fVar29 = auVar36._0_4_;
        auVar38._0_4_ = fVar29 * fVar29;
        fVar33 = auVar36._4_4_;
        auVar38._4_4_ = fVar33 * fVar33;
        fVar34 = auVar36._8_4_;
        auVar38._8_4_ = fVar34 * fVar34;
        fVar35 = auVar36._12_4_;
        auVar38._12_4_ = fVar35 * fVar35;
        auVar41._8_4_ = 0xa59f25c0;
        auVar41._0_8_ = 0xa59f25c0a59f25c0;
        auVar41._12_4_ = 0xa59f25c0;
        auVar45._8_4_ = 0x2a61337e;
        auVar45._0_8_ = 0x2a61337e2a61337e;
        auVar45._12_4_ = 0x2a61337e;
        auVar36 = vfmadd213ps_fma(auVar41,auVar38,auVar45);
        auVar46._8_4_ = 0xaebd37ff;
        auVar46._0_8_ = 0xaebd37ffaebd37ff;
        auVar46._12_4_ = 0xaebd37ff;
        auVar36 = vfmadd213ps_fma(auVar36,auVar38,auVar46);
        auVar47._8_4_ = 0x335c0041;
        auVar47._0_8_ = 0x335c0041335c0041;
        auVar47._12_4_ = 0x335c0041;
        auVar36 = vfmadd213ps_fma(auVar36,auVar38,auVar47);
        auVar48._8_4_ = 0x3779434a;
        auVar48._0_8_ = 0x3779434a3779434a;
        auVar48._12_4_ = 0x3779434a;
        auVar36 = vfmadd213ps_fma(auVar36,auVar38,auVar48);
        auVar49._8_4_ = 0x3a270ded;
        auVar49._0_8_ = 0x3a270ded3a270ded;
        auVar49._12_4_ = 0x3a270ded;
        auVar36 = vfmadd213ps_fma(auVar36,auVar38,auVar49);
        auVar50._8_4_ = 0x3ba059dc;
        auVar50._0_8_ = 0x3ba059dc3ba059dc;
        auVar50._12_4_ = 0x3ba059dc;
        auVar36 = vfmadd213ps_fma(auVar36,auVar38,auVar50);
        auVar32._0_4_ = auVar36._0_4_ * fVar29;
        auVar32._4_4_ = auVar36._4_4_ * fVar33;
        auVar32._8_4_ = auVar36._8_4_ * fVar34;
        auVar32._12_4_ = auVar36._12_4_ * fVar35;
        auVar42._8_4_ = 0x35a0d3d8;
        auVar42._0_8_ = 0x35a0d3d835a0d3d8;
        auVar42._12_4_ = 0x35a0d3d8;
        auVar58._8_4_ = 0x38f895d6;
        auVar58._0_8_ = 0x38f895d638f895d6;
        auVar58._12_4_ = 0x38f895d6;
        auVar36 = vfmadd213ps_fma(auVar42,auVar38,auVar58);
        auVar59._8_4_ = 0x3b14aa05;
        auVar59._0_8_ = 0x3b14aa053b14aa05;
        auVar59._12_4_ = 0x3b14aa05;
        auVar36 = vfmadd213ps_fma(auVar36,auVar38,auVar59);
        auVar27 = vfmadd213ps_fma(auVar36,auVar38,auVar50);
        auVar36 = vrcpps_avx(auVar27);
        auVar51._0_4_ = auVar32._0_4_ * auVar36._0_4_;
        auVar51._4_4_ = auVar32._4_4_ * auVar36._4_4_;
        auVar51._8_4_ = auVar32._8_4_ * auVar36._8_4_;
        auVar51._12_4_ = auVar32._12_4_ * auVar36._12_4_;
        auVar27 = vfmsub213ps_fma(auVar27,auVar51,auVar32);
        auVar36 = vfnmadd213ps_fma(auVar27,auVar36,auVar51);
        in_register_0000125c = 0;
        auVar27._0_4_ = fVar6 * 0.5;
        auVar27._4_4_ = fVar7 * 0.5;
        auVar27._8_4_ = fVar8 * 0.5;
        auVar27._12_4_ = fVar9 * 0.5;
        auVar36 = vfmadd213ps_fma(auVar27,auVar36,auVar27);
        *(undefined1 (*) [16])*pauVar21 = auVar36;
        pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
        lVar24 = lVar24 + 4;
      }
      lVar20 = sVar4 * sVar3 * uVar26;
      for (; (int)lVar24 < iVar22; lVar24 = lVar24 + 1) {
        fVar6 = *(float *)((long)pvVar2 + lVar24 * 4 + lVar20);
        auVar36 = vfmadd213ss_fma(ZEXT416((uint)(fVar6 * fVar6 * 0.044715)),ZEXT416((uint)fVar6),
                                  ZEXT416((uint)fVar6));
        auVar28._0_4_ = tanhf(auVar36._0_4_ * 0.7978845);
        auVar28._4_60_ = extraout_var;
        in_register_0000125c = 0;
        auVar36 = vfmadd213ss_fma(auVar28._0_16_,ZEXT416((uint)(fVar6 * 0.5)),
                                  ZEXT416((uint)(fVar6 * 0.5)));
        *(int *)((long)pvVar2 + lVar24 * 4 + lVar20) = auVar36._0_4_;
      }
    }
    return 0;
  }
  iVar22 = GELU::forward_inplace
                     ((GELU *)((long)&this->_vptr_GELU_x86_fma + (long)this->_vptr_GELU_x86_fma[-3])
                      ,bottom_top_blob,opt);
  return iVar22;
}

Assistant:

int GELU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}